

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O0

void __thiscall
nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::Visibility>>::
initialize<tinyusdz::Animatable<tinyusdz::Visibility>>
          (optional<tinyusdz::Animatable<tinyusdz::Visibility>> *this,
          Animatable<tinyusdz::Visibility> *value)

{
  bool bVar1;
  Animatable<tinyusdz::Visibility> *value_local;
  optional<tinyusdz::Animatable<tinyusdz::Visibility>_> *this_local;
  
  bVar1 = optional<tinyusdz::Animatable<tinyusdz::Visibility>_>::has_value
                    ((optional<tinyusdz::Animatable<tinyusdz::Visibility>_> *)this);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("! has_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/optional.hpp"
                  ,0x5dd,
                  "void nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::Visibility>>::initialize(V &&) [T = tinyusdz::Animatable<tinyusdz::Visibility>, V = tinyusdz::Animatable<tinyusdz::Visibility>]"
                 );
  }
  detail::storage_t<tinyusdz::Animatable<tinyusdz::Visibility>_>::construct_value
            ((storage_t<tinyusdz::Animatable<tinyusdz::Visibility>_> *)(this + 8),value);
  *this = (optional<tinyusdz::Animatable<tinyusdz::Visibility>>)0x1;
  return;
}

Assistant:

void initialize( V && value )
    {
        assert( ! has_value()  );
        contained.construct_value( std::move( value ) );
        has_value_ = true;
    }